

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMTrack.cpp
# Opt level: O2

PCMTrack * __thiscall Storage::Disk::PCMTrack::resampled_clone(PCMTrack *this,size_t bits_per_track)

{
  pointer pPVar1;
  PCMTrack *this_00;
  PCMSegment *segment;
  PCMSegmentEventSource *event_source;
  pointer this_01;
  Time local_40;
  Time start_time;
  
  this_00 = (PCMTrack *)operator_new(0x30);
  PCMTrack(this_00,(uint)bits_per_track);
  start_time.length = 0;
  start_time.clock_rate = 1;
  pPVar1 = (this->segment_event_sources_).
           super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (this->segment_event_sources_).
                 super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != pPVar1; this_01 = this_01 + 1
      ) {
    segment = PCMSegmentEventSource::segment(this_01);
    add_segment(this_00,&start_time,segment,true);
    local_40 = PCMSegment::length(segment);
    Time::operator+=(&start_time,&local_40);
  }
  this_00->is_resampled_clone_ = true;
  return this_00;
}

Assistant:

PCMTrack *PCMTrack::resampled_clone(size_t bits_per_track) {
	// Create an empty track.
	PCMTrack *const new_track = new PCMTrack(unsigned(bits_per_track));

	// Plot all segments from this track onto the destination.
	Time start_time;
	for(const auto &event_source: segment_event_sources_) {
		const PCMSegment &source = event_source.segment();
		new_track->add_segment(start_time, source, true);
		start_time += source.length();
	}

	new_track->is_resampled_clone_ = true;
	return new_track;
}